

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O2

void __thiscall vkb::Result<vkb::PhysicalDevice>::destroy(Result<vkb::PhysicalDevice> *this)

{
  if (this->m_init != true) {
    return;
  }
  std::
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::~_Vector_base((_Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                   *)&(this->field_0).m_value.extended_features_chain);
  std::_Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
  ~_Vector_base(&(this->field_0).m_value.queue_families.
                 super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
               );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->field_0).m_value.available_extensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->field_0).m_value.extensions_to_enable);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }